

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError PaAlsaStream_WaitForFrames(PaAlsaStream *self,unsigned_long *framesAvail,int *xrunOccurred)

{
  PaAlsaStream *pPVar1;
  ulong *puVar2;
  PaError PVar3;
  int iVar4;
  int *piVar5;
  unsigned_long *in_RCX;
  int queryPlayback;
  uint uVar6;
  undefined1 auVar7 [4];
  ulong uVar8;
  pollfd *pfds;
  ulong numFrames;
  char *pcVar9;
  uint uVar10;
  uint uVar11;
  pollfd *pfds_00;
  uint uVar12;
  bool bVar13;
  bool bVar14;
  undefined1 local_6c [4];
  int pollCapture;
  int pollPlayback;
  PaAlsaStream *local_60;
  undefined4 local_58;
  int pollTimeout;
  ulong *local_50;
  PaAlsaStreamComponent *local_48;
  PaAlsaStreamComponent *local_40;
  int *local_38;
  
  bVar13 = (self->playback).pcm != (snd_pcm_t *)0x0;
  pollPlayback = (int)bVar13;
  bVar14 = (self->capture).pcm != (snd_pcm_t *)0x0;
  pollCapture = (int)bVar14;
  pollTimeout = self->pollTimeout;
  local_6c = (undefined1  [4])0x0;
  local_50 = framesAvail;
  local_38 = xrunOccurred;
  if (framesAvail == (unsigned_long *)0x0) {
    __assert_fail("framesAvail",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0xf0e,
                  "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)");
  }
  if (self->callbackMode == 0) {
    in_RCX = framesAvail;
    paUtilErr_ = PaAlsaStream_GetAvailableFrames
                           (self,pollCapture,pollPlayback,framesAvail,(int *)local_6c);
    if (-1 < paUtilErr_) {
      auVar7 = local_6c;
      if (local_6c != (undefined1  [4])0x0) {
        uVar11 = 0xffffd8fe;
        if (*framesAvail != 0) {
          uVar11 = 0;
        }
        goto LAB_00111d44;
      }
      if (*framesAvail != 0) {
        if ((self->capture).pcm != (snd_pcm_t *)0x0) {
          (self->capture).ready = 1;
        }
        uVar11 = 0;
        if ((self->playback).pcm != (snd_pcm_t *)0x0) {
          (self->playback).ready = 1;
        }
        goto LAB_00111d44;
      }
      goto LAB_0011191c;
    }
    pcVar9 = 
    "Expression \'PaAlsaStream_GetAvailableFrames( self, self->capture.pcm != NULL, self->playback.pcm != NULL, framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3860\n"
    ;
  }
  else {
LAB_0011191c:
    local_40 = &self->playback;
    local_48 = &self->capture;
    uVar12 = 0;
    uVar11 = (uint)bVar13;
    uVar6 = (uint)bVar14;
    local_60 = self;
LAB_0011193c:
    do {
      if (uVar11 == 0 && uVar6 == 0) {
        if (local_6c != (undefined1  [4])0x0) {
          uVar11 = 0;
          auVar7 = local_6c;
          goto LAB_00111d44;
        }
        queryPlayback = 0;
        iVar4 = 0;
        if ((self->capture).pcm != (snd_pcm_t *)0x0) {
          iVar4 = (self->capture).ready;
        }
        if ((self->playback).pcm != (snd_pcm_t *)0x0) {
          queryPlayback = (self->playback).ready;
        }
        paUtilErr_ = PaAlsaStream_GetAvailableFrames
                               (self,iVar4,queryPlayback,local_50,(int *)local_6c);
        puVar2 = local_50;
        if (paUtilErr_ < 0) {
          pcVar9 = 
          "Expression \'PaAlsaStream_GetAvailableFrames( self, captureReady, playbackReady, framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4017\n"
          ;
          goto LAB_00111df1;
        }
        auVar7 = local_6c;
        if ((self->capture).pcm == (snd_pcm_t *)0x0) {
          if ((self->playback).ready == 0) {
            __assert_fail("self->playback.ready",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                          ,0xfc2,
                          "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)"
                         );
          }
        }
        else {
          if ((self->playback).pcm != (snd_pcm_t *)0x0) {
            uVar11 = 0;
            if (((self->playback).ready == 0) && (self->neverDropInput == 0)) {
              if ((self->capture).ready == 0) {
                __assert_fail("self->capture.ready",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                              ,0xfb8,
                              "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)"
                             );
              }
              uVar8 = (self->capture).framesPerPeriod;
              numFrames = *local_50;
              if (uVar8 < *local_50) {
                numFrames = uVar8;
              }
              PaAlsaStreamComponent_EndProcessing(local_48,numFrames,(int *)local_6c);
              *puVar2 = 0;
              (self->capture).ready = 0;
              auVar7 = local_6c;
            }
            goto LAB_00111d44;
          }
          if ((self->capture).ready == 0) {
            __assert_fail("self->capture.ready",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                          ,0xfc0,
                          "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)"
                         );
          }
        }
        uVar11 = 0;
        goto LAB_00111d44;
      }
      pthread_testcancel();
      if (uVar6 != 0) {
        pfds_00 = self->pfds;
        PVar3 = PaAlsaStreamComponent_BeginPolling(local_48,pfds_00);
        if (PVar3 == 0) {
          uVar10 = (self->capture).nfds;
          uVar8 = (ulong)uVar10;
          if (uVar11 != 0) goto LAB_00111987;
          in_RCX = (unsigned_long *)CONCAT71((int7)((ulong)in_RCX >> 8),1);
          local_58 = SUB84(in_RCX,0);
          pfds = (pollfd *)0x0;
          goto LAB_001119cd;
        }
LAB_00111b9f:
        uVar11 = 0;
LAB_00111ba2:
        auVar7 = (undefined1  [4])1;
        goto LAB_00111d44;
      }
      pfds_00 = (pollfd *)0x0;
      if (uVar11 == 0) {
        in_RCX = (unsigned_long *)CONCAT71((int7)((ulong)in_RCX >> 8),1);
        local_58 = SUB84(in_RCX,0);
        pfds = (pollfd *)0x0;
        uVar10 = 0;
      }
      else {
        uVar10 = 0;
        uVar8 = 0;
LAB_00111987:
        pfds = self->pfds + uVar8;
        PVar3 = PaAlsaStreamComponent_BeginPolling(local_40,pfds);
        if (PVar3 != 0) goto LAB_00111b9f;
        uVar10 = uVar10 + (self->playback).nfds;
        local_58 = 0;
      }
LAB_001119cd:
      if (self->callbackMode != 0) {
        pthread_setcancelstate(0,(int *)0x0);
      }
      pPVar1 = local_60;
      iVar4 = poll((pollfd *)local_60->pfds,(long)(int)uVar10,pollTimeout);
      if (pPVar1->callbackMode != 0) {
        pthread_setcancelstate(1,(int *)0x0);
      }
      self = local_60;
      if (iVar4 < 0) {
        piVar5 = __errno_location();
        if (*piVar5 != 4) {
          paUtilErr_ = -0x2702;
          pcVar9 = 
          "Expression \'paInternalError\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3943\n"
          ;
LAB_00111ccf:
          PaUtil_DebugPrint(pcVar9);
          uVar11 = paUtilErr_;
          auVar7 = local_6c;
          self = local_60;
          goto LAB_00111d44;
        }
        Pa_Sleep(1);
        self = local_60;
        uVar11 = pollPlayback;
        uVar6 = pollCapture;
        goto LAB_0011193c;
      }
      if (iVar4 == 0) {
        uVar11 = uVar12 + 1;
        if ((0 < (int)uVar12) && (Pa_Sleep(1), 0x7fe < uVar12)) {
          *local_50 = 0;
          uVar11 = 0xffffd8fd;
          goto LAB_00111ba2;
        }
      }
      else {
        if (uVar6 != 0) {
          in_RCX = (unsigned_long *)local_6c;
          paUtilErr_ = PaAlsaStreamComponent_EndPolling(local_48,pfds_00,&pollCapture,(int *)in_RCX)
          ;
          if (paUtilErr_ < 0) {
            pcVar9 = 
            "Expression \'PaAlsaStreamComponent_EndPolling( &self->capture, capturePfds, &pollCapture, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3979\n"
            ;
            goto LAB_00111ccf;
          }
        }
        if ((char)local_58 == '\0') {
          in_RCX = (unsigned_long *)local_6c;
          paUtilErr_ = PaAlsaStreamComponent_EndPolling(local_40,pfds,&pollPlayback,(int *)in_RCX);
          if (paUtilErr_ < 0) {
            pcVar9 = 
            "Expression \'PaAlsaStreamComponent_EndPolling( &self->playback, playbackPfds, &pollPlayback, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3983\n"
            ;
            goto LAB_00111ccf;
          }
        }
        self = local_60;
        uVar11 = 0;
        auVar7 = local_6c;
        if (local_6c != (undefined1  [4])0x0) goto LAB_00111d44;
      }
      uVar12 = uVar11;
      uVar11 = pollPlayback;
      uVar6 = pollCapture;
    } while (((self->capture).pcm == (snd_pcm_t *)0x0) || ((self->playback).pcm == (snd_pcm_t *)0x0)
            );
    if (pollPlayback != 0 || pollCapture == 0) {
      in_RCX = (unsigned_long *)(ulong)CONCAT31((int3)((uint)pollPlayback >> 8),pollPlayback == 0);
      if (pollCapture == 0 && pollPlayback != 0) {
        in_RCX = (unsigned_long *)&pollPlayback;
        paUtilErr_ = ContinuePoll(self,StreamDirection_Out,&pollTimeout,(int *)in_RCX);
        uVar11 = pollPlayback;
        uVar6 = pollCapture;
        if (paUtilErr_ < 0) {
          pcVar9 = 
          "Expression \'ContinuePoll( self, StreamDirection_Out, &pollTimeout, &pollPlayback )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4003\n"
          ;
          goto LAB_00111df1;
        }
      }
      goto LAB_0011193c;
    }
    in_RCX = (unsigned_long *)&pollCapture;
    paUtilErr_ = ContinuePoll(self,StreamDirection_In,&pollTimeout,(int *)in_RCX);
    uVar11 = pollPlayback;
    uVar6 = pollCapture;
    if (-1 < paUtilErr_) goto LAB_0011193c;
    pcVar9 = 
    "Expression \'ContinuePoll( self, StreamDirection_In, &pollTimeout, &pollCapture )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3999\n"
    ;
  }
LAB_00111df1:
  PaUtil_DebugPrint(pcVar9);
  uVar11 = paUtilErr_;
  auVar7 = local_6c;
LAB_00111d44:
  do {
    if (auVar7 != (undefined1  [4])0x0) {
      paUtilErr_ = PaAlsaStream_HandleXrun(self);
      if (-1 < paUtilErr_) {
        *local_50 = 0;
LAB_00111da7:
        *local_38 = (int)auVar7;
        return uVar11;
      }
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStream_HandleXrun( self )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4042\n"
                       );
      uVar11 = paUtilErr_;
      goto LAB_00111d44;
    }
    if (((*local_50 == 0) || ((self->capture).ready != 0)) || ((self->playback).ready != 0))
    goto LAB_00111da7;
    PaUtil_DebugPrint(
                     "Expression \'self->capture.ready || self->playback.ready\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4050\n"
                     );
    uVar11 = 0xffffd8fe;
  } while( true );
}

Assistant:

static PaError PaAlsaStream_WaitForFrames( PaAlsaStream *self, unsigned long *framesAvail, int *xrunOccurred )
{
    PaError result = paNoError;
    int pollPlayback = self->playback.pcm != NULL, pollCapture = self->capture.pcm != NULL;
    int pollTimeout = self->pollTimeout;
    int xrun = 0, timeouts = 0;
    int pollResults;

    assert( self );
    assert( framesAvail );

    if( !self->callbackMode )
    {
        /* In blocking mode we will only wait if necessary */
        PA_ENSURE( PaAlsaStream_GetAvailableFrames( self, self->capture.pcm != NULL, self->playback.pcm != NULL,
                    framesAvail, &xrun ) );
        if( xrun )
        {
            if(*framesAvail == 0)
            {
                result = paInternalError;
            }
            goto end;
        }

        if( *framesAvail > 0 )
        {
            /* Mark pcms ready from poll */
            if( self->capture.pcm )
                self->capture.ready = 1;
            if( self->playback.pcm )
                self->playback.ready = 1;

            goto end;
        }
    }

    while( pollPlayback || pollCapture )
    {
        int totalFds = 0;
        struct pollfd *capturePfds = NULL, *playbackPfds = NULL;

#ifdef PTHREAD_CANCELED
        pthread_testcancel();
#endif
        if( pollCapture )
        {
            capturePfds = self->pfds;
            PaError res = PaAlsaStreamComponent_BeginPolling( &self->capture, capturePfds );
            if( res != paNoError)
            {
                xrun = 1;
                goto end;
            }
            totalFds += self->capture.nfds;
        }
        if( pollPlayback )
        {
            /* self->pfds is in effect an array of fds; if necessary, index past the capture fds */
            playbackPfds = self->pfds + (pollCapture ? self->capture.nfds : 0);
            PaError res = PaAlsaStreamComponent_BeginPolling( &self->playback, playbackPfds );
            if( res != paNoError)
            {
                xrun = 1;
                goto end;
            }
            totalFds += self->playback.nfds;
        }

#ifdef PTHREAD_CANCELED
        if( self->callbackMode )
        {
            /* To allow 'Abort' to terminate the callback thread, enable cancelability just for poll() (& disable after) */
            pthread_setcancelstate( PTHREAD_CANCEL_ENABLE, NULL );
        }
#endif

        pollResults = poll( self->pfds, totalFds, pollTimeout );

#ifdef PTHREAD_CANCELED
        if( self->callbackMode )
        {
            pthread_setcancelstate( PTHREAD_CANCEL_DISABLE, NULL );
        }
#endif

        if( pollResults < 0 )
        {
            /*  XXX: Depend on preprocessor condition? */
            if( errno == EINTR )
            {
                /* gdb */
                Pa_Sleep( 1 ); /* avoid hot loop */
                continue;
            }
            result = paInternalError;

            /* TODO: Add macro for checking system calls */
            PA_ENSURE( paInternalError );
        }
        else if( pollResults == 0 )
        {
           /* Suspended, paused or failed device can provide 0 poll results. To avoid deadloop in such situation
            * we simply run counter 'timeouts' which detects 0 poll result and accumulates. As soon as 2048 timouts (around 2 seconds)
            * are achieved we simply fail function with paTimedOut to notify waiting methods that device is not capable
            * of providing audio data anymore and needs some corresponding recovery action.
            * Note that 'timeouts' is reset to 0 if poll() managed to return non 0 results.
            */

            /*PA_DEBUG(( "%s: poll == 0 results, timed out, %d times left\n", __FUNCTION__, 2048 - timeouts ));*/
            ++ timeouts;
            if( timeouts > 1 ) /* sometimes device times out, but normally once, so we do not sleep any time */
            {
                Pa_Sleep( 1 ); /* avoid hot loop */
            }
            /* not else ! */
            if( timeouts >= 2048 ) /* audio device not working, shall return error to notify waiters */
            {
                *framesAvail = 0; /* no frames available for processing */
                xrun = 1; /* try recovering device */

                PA_DEBUG(( "%s: poll timed out\n", __FUNCTION__, timeouts ));
                result = paTimedOut;
                goto end;/*PA_ENSURE( paTimedOut );*/
            }
        }
        else if( pollResults > 0 )
        {
            /* reset timouts counter */
            timeouts = 0;

            /* check the return status of our pfds */
            if( pollCapture )
            {
                PA_ENSURE( PaAlsaStreamComponent_EndPolling( &self->capture, capturePfds, &pollCapture, &xrun ) );
            }
            if( pollPlayback )
            {
                PA_ENSURE( PaAlsaStreamComponent_EndPolling( &self->playback, playbackPfds, &pollPlayback, &xrun ) );
            }
            if( xrun )
            {
                break;
            }
        }

        /* @concern FullDuplex If only one of two pcms is ready we may want to compromise between the two.
         * If there is less than half a period's worth of samples left of frames in the other pcm's buffer we will
         * stop polling.
         */
        if( self->capture.pcm && self->playback.pcm )
        {
            if( pollCapture && !pollPlayback )
            {
                PA_ENSURE( ContinuePoll( self, StreamDirection_In, &pollTimeout, &pollCapture ) );
            }
            else if( pollPlayback && !pollCapture )
            {
                PA_ENSURE( ContinuePoll( self, StreamDirection_Out, &pollTimeout, &pollPlayback ) );
            }
        }
    }

    if( !xrun )
    {
        /* Get the number of available frames for the pcms that are marked ready.
         * @concern FullDuplex If only one direction is marked ready (from poll), the number of frames available for
         * the other direction is returned. Output is normally preferred over capture however, so capture frames may be
         * discarded to avoid overrun unless paNeverDropInput is specified.
         */
        int captureReady = self->capture.pcm ? self->capture.ready : 0,
            playbackReady = self->playback.pcm ? self->playback.ready : 0;
        PA_ENSURE( PaAlsaStream_GetAvailableFrames( self, captureReady, playbackReady, framesAvail, &xrun ) );

        if( self->capture.pcm && self->playback.pcm )
        {
            if( !self->playback.ready && !self->neverDropInput )
            {
                /* Drop input, a period's worth */
                assert( self->capture.ready );
                PaAlsaStreamComponent_EndProcessing( &self->capture, PA_MIN( self->capture.framesPerPeriod,
                            *framesAvail ), &xrun );
                *framesAvail = 0;
                self->capture.ready = 0;
            }
        }
        else if( self->capture.pcm )
            assert( self->capture.ready );
        else
            assert( self->playback.ready );
    }

end:
error:
    if( xrun )
    {
        /* Recover from the xrun state */
        PA_ENSURE( PaAlsaStream_HandleXrun( self ) );
        *framesAvail = 0;
    }
    else
    {
        if( 0 != *framesAvail )
        {
            /* If we're reporting frames eligible for processing, one of the handles better be ready */
            PA_UNLESS( self->capture.ready || self->playback.ready, paInternalError );
        }
    }
    *xrunOccurred = xrun;

    return result;
}